

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptError.cpp
# Opt level: O0

HRESULT Js::JavascriptError::GetRuntimeErrorWithScriptEnter
                  (RecyclableObject *errorObject,LPCWSTR *pMessage)

{
  code *pcVar1;
  bool bVar2;
  HRESULT HVar3;
  ScriptContext *this;
  ThreadContext *this_00;
  undefined4 *puVar4;
  void *unaff_retaddr;
  undefined1 local_90 [8];
  EnterScriptObject __enterScriptObject;
  ScriptEntryExitRecord __entryExitRecord;
  ScriptContext *__localScriptContext;
  ScriptContext *scriptContext;
  LPCWSTR *pMessage_local;
  RecyclableObject *errorObject_local;
  
  this = RecyclableObject::GetScriptContext(errorObject);
  this_00 = ScriptContext::GetThreadContext(this);
  bVar2 = ThreadContext::IsScriptActive(this_00);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptError.cpp"
                                ,0x256,"(!scriptContext->GetThreadContext()->IsScriptActive())",
                                "!scriptContext->GetThreadContext()->IsScriptActive()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  __enterScriptObject.library = (JavascriptLibrary *)0x0;
  EnterScriptObject::EnterScriptObject
            ((EnterScriptObject *)local_90,this,
             (ScriptEntryExitRecord *)&__enterScriptObject.library,unaff_retaddr,&stack0x00000000,
             false,false,false);
  ScriptContext::OnScriptStart(this,false,false);
  EnterScriptObject::VerifyEnterScript((EnterScriptObject *)local_90);
  HVar3 = GetRuntimeError(errorObject,pMessage);
  EnterScriptObject::~EnterScriptObject((EnterScriptObject *)local_90);
  return HVar3;
}

Assistant:

HRESULT JavascriptError::GetRuntimeErrorWithScriptEnter(RecyclableObject* errorObject, __out_opt LPCWSTR * pMessage)
    {
        ScriptContext* scriptContext = errorObject->GetScriptContext();
        Assert(!scriptContext->GetThreadContext()->IsScriptActive());

        // Use _NOT_SCRIPT. We enter runtime to get error info, likely inside a catch.
        BEGIN_JS_RUNTIME_CALL_NOT_SCRIPT(scriptContext)
        {
            return GetRuntimeError(errorObject, pMessage);
        }
        END_JS_RUNTIME_CALL(scriptContext);
    }